

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fade.cpp
# Opt level: O2

void __thiscall
Fade::mergeCategoricalValues
          (Fade *this,vector<double,_std::allocator<double>_> *out,int *outOffsets,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *in,vector<int_*,_std::allocator<int_*>_> *inOffsets)

{
  double *pdVar1;
  uint uVar2;
  int iVar3;
  pointer pvVar4;
  long lVar5;
  pointer ppiVar6;
  vector<double,_std::allocator<double>_> *this_00;
  int k_1;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  value_type_conflict3 vVar10;
  value_type_conflict3 *pvVar11;
  value_type_conflict3 *pvVar12;
  int iVar13;
  long lVar14;
  int k;
  ulong uVar15;
  pointer pvVar16;
  long lVar17;
  int *__s;
  int *piVar18;
  ulong uVar19;
  value_type_conflict3 *pvVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  long lStack_b0;
  value_type_conflict3 local_a8;
  vector<int_*,_std::allocator<int_*>_> *local_a0;
  long local_98;
  ulong local_90;
  int *local_88;
  Fade *local_80;
  long local_78;
  value_type_conflict3 local_70;
  double agg;
  ulong local_60;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_58;
  int local_4c;
  vector<double,_std::allocator<double>_> *local_48;
  ulong local_40;
  ulong local_38;
  
  lVar9 = (long)((this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_root
                ->_id;
  uVar2 = this->_numberOfAggregatesPerNode[_NUM_OF_ATTRIBUTES * 2 + lVar9];
  local_78 = (long)this->_numberOfAggregatesPerNode[_NUM_OF_ATTRIBUTES * 3 + lVar9];
  lStack_b0 = 0x18;
  uVar7 = ((long)(in->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
          (long)(in->
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start) / 0x18;
  pvVar11 = &local_a8 + dfdb::params::DEGREE_OF_INTERACTIONS * -2;
  pvVar20 = pvVar11 + dfdb::params::DEGREE_OF_INTERACTIONS * -2;
  iVar13 = (int)uVar7;
  __s = (int *)((long)pvVar20 - ((uVar7 & 0xffffffff) * 4 + 0xf & 0xfffffffffffffff0));
  local_a0 = inOffsets;
  local_88 = outOffsets;
  local_80 = this;
  local_58 = in;
  local_48 = out;
  __s[-2] = 0x138e5f;
  __s[-1] = 0;
  memset(__s,0,(long)iVar13 * 4);
  local_38 = 0;
  local_98 = (long)iVar13;
  local_a8 = 0.0;
  if (0 < iVar13) {
    local_a8 = (value_type_conflict3)(uVar7 & 0xffffffff);
  }
  local_90 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    local_90 = local_38;
  }
  agg = (double)__s;
  piVar18 = __s;
  do {
    if (local_38 == local_90) {
      return;
    }
    uVar2 = local_80->_degreeOfCategoricalAggregateGroup[local_38 + local_78];
    pvVar4 = (local_58->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_40 = (ulong)uVar2;
    uVar7 = 0;
    if (0 < (int)uVar2) {
      uVar7 = (ulong)uVar2;
    }
    for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      pvVar11[uVar8] =
           *(value_type_conflict3 *)
            (*(long *)&(pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + ((long)*piVar18 + uVar8) * 8);
      pvVar20[uVar8] = 1.79769313486232e+308;
    }
    __s[-2] = 1;
    __s[-1] = 0;
    for (lVar9 = *(long *)(__s + -2); lVar9 < local_98; lVar9 = lVar9 + 1) {
      lVar14 = 0;
      uVar15 = 0;
      pvVar12 = pvVar11;
      uVar8 = local_40;
      do {
        if (uVar15 == uVar7) break;
        iVar13 = piVar18[lVar9];
        lVar17 = (long)(int)uVar15 + (long)iVar13;
        lVar5 = *(long *)&pvVar4[lVar9].super__Vector_base<double,_std::allocator<double>_>._M_impl;
        dVar21 = *(double *)(lVar5 + lVar17 * 8);
        dVar22 = pvVar11[uVar15];
        if (dVar21 < dVar22) {
          for (uVar19 = 0; uVar8 != uVar19; uVar19 = uVar19 + 1) {
            pvVar12[uVar19] =
                 *(value_type_conflict3 *)(lVar14 + (long)iVar13 * 8 + lVar5 + uVar19 * 8);
          }
          dVar21 = *(double *)(lVar5 + lVar17 * 8);
          dVar22 = pvVar11[uVar15];
          piVar18 = (int *)agg;
        }
        uVar15 = uVar15 + 1;
        lVar14 = lVar14 + 8;
        uVar8 = uVar8 - 1;
        pvVar12 = pvVar12 + 1;
      } while (dVar21 <= dVar22);
    }
    local_4c = (int)local_40 + 1;
    uVar8 = local_38;
    do {
      local_70 = 0.0;
      ppiVar6 = (local_a0->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pvVar4 = (local_58->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      dVar21 = 0.0;
      local_60 = 0;
      for (vVar10 = 0.0; uVar15 = uVar7, pvVar12 = pvVar11, vVar10 != local_a8;
          vVar10 = (value_type_conflict3)((long)vVar10 + 1)) {
        iVar13 = piVar18[(long)vVar10];
        iVar3 = ppiVar6[(long)vVar10][uVar8];
        if (iVar13 < iVar3) {
          pvVar16 = pvVar4 + (long)vVar10;
          uVar8 = 0;
          while (uVar7 != uVar8) {
            lVar9 = *(long *)&(pvVar16->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                              .super__Vector_impl_data;
            dVar22 = *(double *)(lVar9 + (long)iVar13 * 8 + uVar8 * 8);
            pdVar1 = pvVar11 + uVar8;
            uVar8 = uVar8 + 1;
            if ((dVar22 != *pdVar1) || (NAN(dVar22) || NAN(*pdVar1))) goto LAB_00139039;
          }
          lVar9 = *(long *)&(pvVar16->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data;
          dVar21 = dVar21 + *(double *)(lVar9 + (long)((int)local_40 + iVar13) * 8);
          local_70 = dVar21;
          iVar13 = iVar13 + local_4c;
          piVar18[(long)vVar10] = iVar13;
LAB_00139039:
          uVar8 = local_38;
          if (iVar13 < iVar3) {
            lVar14 = lVar9 + (long)iVar13 * 8;
            uVar19 = 0;
            pvVar12 = pvVar20;
            uVar15 = local_40;
            do {
              if (uVar19 == uVar7) {
                local_60 = CONCAT71((int7)((ulong)lVar9 >> 8),1);
                uVar8 = local_38;
                break;
              }
              dVar22 = *(double *)(lVar9 + (uVar19 + (long)iVar13) * 8);
              dVar23 = pvVar20[uVar19];
              if (dVar22 < dVar23) {
                for (uVar8 = 0; uVar15 != uVar8; uVar8 = uVar8 + 1) {
                  pvVar12[uVar8] = *(value_type_conflict3 *)(lVar14 + uVar8 * 8);
                }
                dVar23 = pvVar20[uVar19];
              }
              uVar19 = uVar19 + 1;
              uVar15 = uVar15 - 1;
              pvVar12 = pvVar12 + 1;
              lVar14 = lVar14 + 8;
              uVar8 = local_38;
            } while (dVar22 <= dVar23);
          }
        }
      }
      while (this_00 = local_48, uVar15 != 0) {
        __s[-2] = 0x1390ca;
        __s[-1] = 0;
        std::vector<double,_std::allocator<double>_>::push_back(this_00,pvVar12);
        uVar15 = uVar15 - 1;
        pvVar12 = pvVar12 + 1;
      }
      __s[-2] = 0x1390dd;
      __s[-1] = 0;
      std::vector<double,_std::allocator<double>_>::push_back(this_00,&local_70);
      uVar8 = local_38;
      piVar18 = (int *)agg;
      for (uVar15 = 0; uVar7 != uVar15; uVar15 = uVar15 + 1) {
        pvVar11[uVar15] = pvVar20[uVar15];
        pvVar20[uVar15] = 1.79769313486232e+308;
      }
    } while ((local_60 & 1) != 0);
    local_88[uVar8] =
         (int)((ulong)((long)(local_48->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                             .super__Vector_impl_data._M_finish -
                      (long)(local_48->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start) >> 3);
    local_38 = uVar8 + 1;
  } while( true );
}

Assistant:

void Fade::mergeCategoricalValues(vector<double>& out, int* outOffsets,
	std::vector<std::vector<double> > const &in, std::vector<int*> const &inOffsets)
{
	int rootID = _dTree->_root->_id;
	int numOfAggGroups = _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 2 + rootID];
	int firstCatAggOffset = _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 3 + rootID];

	int numOfPartitions = in.size();
        
	double minVal[DEGREE_OF_INTERACTIONS * 2];
	double nextMinVal[DEGREE_OF_INTERACTIONS * 2];

	int pointer[numOfPartitions];
	memset(&pointer[0], 0, sizeof(int) * numOfPartitions);

	for (int aggGroup = 0; aggGroup < numOfAggGroups; ++aggGroup)
	{
		int degreeOfAggGroup = _degreeOfCategoricalAggregateGroup[firstCatAggOffset + aggGroup];

		/* initialize minVal and nextMinVal */
		for (int k = 0; k < degreeOfAggGroup; ++k)
		{
			minVal[k] = in[0][pointer[0] + k];
			nextMinVal[k] = std::numeric_limits<double>::max();
		}

		/* find the minimum value array */
		for (int part = 1; part < numOfPartitions; ++part)
		{
			for (int k = 0; k < degreeOfAggGroup; ++k)
			{
				if (in[part][pointer[part] + k] < minVal[k])
				{
					for (int l = k; l < degreeOfAggGroup; ++l)
						minVal[l] = in[part][pointer[part] + l];
				}
				if (in[part][pointer[part] + k] > minVal[k])
					break;
			}
		}

		bool newValue = true;
		while (newValue)
		{
			double agg = 0.0;
			newValue = false;

			bool isMinVal;

			for (int j = 0; j < numOfPartitions; ++j)
			{
				if (pointer[j] < inOffsets[j][aggGroup])
				{
					auto& a = in[j];

				 	isMinVal = true;

					for (int k = 0; k < degreeOfAggGroup; ++k)
					{
                        int x = pointer[j] + k;

						if (a[x] != minVal[k])
						{
							isMinVal = false;
							break;
						}
					}

					if (isMinVal)
					{
						// printf("isMinVal %d  pointer[j] %d  inOff[j][i] %d \n", isMinVal, pointer[j], inOffsets[j][aggGroup]);
					  	agg += a[pointer[j] + degreeOfAggGroup];
						pointer[j] += degreeOfAggGroup + 1;
					}

					isMinVal = false;

					// printf("id: %d d: %d pointer[j]: %d  childAggCounts[d][j][i]: %d \n", nodeID, d, pointer[j], childAggCounts[d][j][i]);
					if (pointer[j] < inOffsets[j][aggGroup])
					{
						isMinVal = true;

						for (int k = 0; k < degreeOfAggGroup; ++k)
						{
							if (a[pointer[j] + k] < nextMinVal[k])
							{
								for (int l = k; l < degreeOfAggGroup; ++l)
								{
									nextMinVal[l] = a[pointer[j] + l];
								}
							}
							if (a[pointer[j] + k] > nextMinVal[k])
							{
								isMinVal = false;
								break;
							}
                            // printf("nextMinVal: %f \n", nextMinVal[k]);
						}
					}
					// printf("isMinVal %d   Degree:  %lu   nodeID: %d \n", isMinVal, d, nodeID);

					if (isMinVal) newValue = true;
				}
			}

            // printf("nextMinVal: ");
            // for (int k = 0; k < degreeOfAggGroup; ++k)
            //     printf("%.2f ", nextMinVal[k]);
            // printf("\n");

			for (int k = 0; k < degreeOfAggGroup; ++k)
			{
				// printf("minVal entered:  %f \n", minVal[k]);
				out.push_back(minVal[k]);
			}

			//printf("agg entered:  %f \n", agg);
			out.push_back(agg);

			for (int k = 0; k < degreeOfAggGroup; ++k)
			{
				minVal[k] = nextMinVal[k];
				nextMinVal[k] =  std::numeric_limits<double>::max();
			}
		}

		for (int j = 0; j < numOfPartitions; ++j)
			assert(pointer[j] == inOffsets[j][aggGroup]);

		outOffsets[aggGroup] = out.size();
	}

	// printf("outAggregates:  ");	int off = 0;
	// for (size_t i = 0; i < out.size(); ++i) {
	// 	if (i == (size_t) outOffsets[off]) {
	// 		printf(" | "); ++off; }
	// 	printf("%.2f ", out[i]);
	// } printf("\n");
	// printf("outOffsets:  ");
	// for (int i = 0; i < numOfAggGroups; ++i)
	// 	printf("%d ", outOffsets[i]);
	// printf("\n");
}